

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::SetObjectBeforeCollectCallback
          (Recycler *this,void *object,ObjectBeforeCollectCallback callback,void *callbackState,
          ObjectBeforeCollectCallbackWrapper callbackWrapper,void *threadContext)

{
  RealCount *pRVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  bool bVar2;
  ObjectBeforeCollectCallbackList *pOVar3;
  Type pSVar4;
  Type *pTVar5;
  undefined1 local_60 [8];
  EditingIterator iter;
  NodeBase *local_40;
  void *object_local;
  
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_Shutdown) {
    local_40 = (NodeBase *)object;
    if (this->objectBeforeCollectCallbackList == (ObjectBeforeCollectCallbackList *)0x0) {
      if (callback == (ObjectBeforeCollectCallback)0x0) {
        return;
      }
      object_local = &this->objectBeforeCollectCallbackArena;
      pOVar3 = (ObjectBeforeCollectCallbackList *)
               new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)object_local,0x366bee);
      (pOVar3->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_RealCount.count = 0;
      (pOVar3->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pOVar3;
      pOVar3->allocator = (Type)object_local;
      this->objectBeforeCollectCallbackList = pOVar3;
    }
    if (callback == (ObjectBeforeCollectCallback)0x0) {
      local_60 = (undefined1  [8])this->objectBeforeCollectCallbackList;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            *)local_60;
      bVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
              ::EditingIterator::Next((EditingIterator *)local_60);
      if (bVar2) {
        do {
          pTVar5 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)local_60);
          buffer = iter.super_EditingIterator.super_Iterator.list;
          if ((NodeBase *)pTVar5->object == local_40) {
            this_00 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                       ((long)local_60 + 0x10);
            SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
            ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      (this_00,buffer,0x30);
          }
          bVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  ::EditingIterator::Next((EditingIterator *)local_60);
        } while (bVar2);
      }
    }
    else {
      pOVar3 = this->objectBeforeCollectCallbackList;
      iter.super_EditingIterator.last = local_40;
      object_local = callbackWrapper;
      pSVar4 = (Type)new<Memory::ArenaAllocator>(0x30,pOVar3->allocator,0x366bee);
      pSVar4[1].next = iter.super_EditingIterator.last;
      pSVar4[2].next = (Type)callback;
      pSVar4[3].next = (Type)callbackState;
      pSVar4[4].next = (Type)threadContext;
      pSVar4[5].next = (Type)object_local;
      pSVar4->next = (pOVar3->
                     super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     ).super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pOVar3->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
      pRVar1 = &(pOVar3->
                super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                ).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
        ScanMemory<false>(this,&local_40,8);
        ProcessMark(this,false);
      }
    }
  }
  return;
}

Assistant:

void Recycler::SetObjectBeforeCollectCallback(void* object,
    ObjectBeforeCollectCallback callback,
    void* callbackState,
    ObjectBeforeCollectCallbackWrapper callbackWrapper,
    void* threadContext)
{
    if (objectBeforeCollectCallbackState == ObjectBeforeCollectCallback_Shutdown)
    {
        return; // NOP at shutdown
    }

    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        if (callback == nullptr) return;
        this->objectBeforeCollectCallbackList = Anew(&this->objectBeforeCollectCallbackArena, ObjectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    }

    if (callback)
    {
        this->objectBeforeCollectCallbackList->Push(ObjectBeforeCollectCallbackData(object, callbackWrapper, callback, callbackState, threadContext));

        if (this->IsInObjectBeforeCollectCallback()) // revive
        {
            this->ScanMemory<false>(&object, sizeof(object));
            this->ProcessMark(/*background*/false);
        }
    }
    else
    {
        // null callback means unregister
        FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, callbackData, this->objectBeforeCollectCallbackList, iter)
        {
            if (callbackData.object == object)
            {
                iter.RemoveCurrent();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }

}